

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O1

void CVmBifTIO::log_console_create(uint argc)

{
  uint *puVar1;
  vm_val_t *this;
  vm_datatype_t vVar2;
  vm_val_t *pvVar3;
  long lVar4;
  void *pvVar5;
  int32_t width;
  int iVar6;
  ushort *puVar7;
  char *table_name;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CCharmapToLocal *cmap;
  CVmNetFile *nf;
  FILE *fp;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  uint local_158 [2];
  long local_150;
  void *local_148;
  __jmp_buf_tag local_140;
  vm_rcdesc local_78;
  undefined4 extraout_var_01;
  
  CVmBif::check_argc(argc,3);
  pvVar3 = sp_;
  this = sp_ + -2;
  if (sp_[-3].typ == VM_INT) {
    width = sp_[-3].val.intval;
  }
  else {
    width = vm_val_t::nonint_num_to_int(sp_ + -3);
  }
  vVar2 = this->typ;
  if (vVar2 == VM_OBJ) {
    iVar6 = (**(code **)(*(long *)&G_obj_table_X.pages_[pvVar3[-2].val.obj >> 0xc]
                                   [pvVar3[-2].val.obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[pvVar3[-2].val.obj >> 0xc] +
                       (pvVar3[-2].val.obj & 0xfff),CVmObjCharSet::metaclass_reg_);
    if (iVar6 == 0) goto LAB_00232755;
    cmap = CVmObjCharSet::get_to_local
                     ((CVmObjCharSet *)
                      ((long)&G_obj_table_X.pages_[pvVar3[-2].val.obj >> 0xc]->ptr_ +
                      (ulong)((pvVar3[-2].val.obj & 0xfff) * 0x18)));
  }
  else {
    cmap = G_cmap_to_log_X;
    if (vVar2 != VM_NIL) {
LAB_00232755:
      puVar7 = (ushort *)vm_val_t::get_as_string(this);
      if (puVar7 == (ushort *)0x0) {
        err_throw(0x900);
      }
      table_name = lib_copy_str((char *)(puVar7 + 1),(ulong)*puVar7);
      iVar6 = (*G_host_ifc_X->_vptr_CVmHostIfc[7])();
      cmap = CCharmapToLocal::load((CResLoader *)CONCAT44(extraout_var,iVar6),table_name);
      lib_free_str(table_name);
      goto LAB_002327a3;
    }
  }
  puVar1 = &(cmap->super_CCharmap).ref_cnt_;
  *puVar1 = *puVar1 + 1;
LAB_002327a3:
  if (cmap == (CCharmapToLocal *)0x0) {
    iVar6 = (*G_host_ifc_X->_vptr_CVmHostIfc[7])();
    cmap = CCharmapToLocal::load((CResLoader *)CONCAT44(extraout_var_00,iVar6),"us-ascii");
  }
  G_err_frame::__tls_init();
  local_150 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_158;
  local_158[0] = _setjmp(&local_140);
  iVar6 = 0;
  if (local_158[0] == 0) {
    vm_rcdesc::init(&local_78,(EVP_PKEY_CTX *)"logConsoleCreate");
    iVar6 = CVmNetFile::open((char *)(pvVar3 + -1),(int)&local_78,0xe,2,"text/plain");
    nf = (CVmNetFile *)CONCAT44(extraout_var_01,iVar6);
    CVmObjFile::check_safety_for_open(nf,2);
    fp = fopen(nf->lclfname,"w");
    if (fp == (FILE *)0x0) {
      CVmRun::throw_new_class
                (&G_interpreter_X,G_predef_X.file_creation_exc,0,"error creating log file");
    }
    iVar6 = CVmLogConsoleManager::create_log_console
                      (G_console_X->log_console_manager_,nf,(osfildef *)fp,cmap,width);
  }
  if (-1 < (short)local_158[0]) {
    local_158[0] = local_158[0] | 0x8000;
    puVar1 = &(cmap->super_CCharmap).ref_cnt_;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(cmap->super_CCharmap)._vptr_CCharmap[1])(cmap);
    }
  }
  lVar4 = local_150;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar4;
  if ((local_158[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar5 = local_148;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar5;
    err_rethrow();
  }
  if ((local_158[0] & 2) != 0) {
    free(local_148);
  }
  sp_ = sp_ + -(long)(int)argc;
  if (iVar6 == 0) {
    CVmBif::retval_nil();
  }
  else {
    CVmBif::retval_int((long)iVar6);
  }
  return;
}

Assistant:

void CVmBifTIO::log_console_create(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 3);

    /* get the arguments: log file name, character set, and width */
    const vm_val_t *filespec = G_stk->get(0);
    const vm_val_t *charset = G_stk->get(1);
    int width = G_stk->get(2)->num_to_int(vmg0_);

    /* 
     *   Retrieve the character mapper, which can be given as either a
     *   CharacterSet object or a string giving the character set name.  
     */
    CCharmapToLocal *cmap = 0;
    if (charset->typ == VM_NIL)
    {
        /* nil - use the default log file character set */
        cmap = G_cmap_to_log;
        cmap->add_ref();
    }
    else if (charset->typ == VM_OBJ
             && CVmObjCharSet::is_charset(vmg_ charset->val.obj))
    {
        /* it's a CharacterSet object - pop the reference */
        vm_obj_id_t obj = charset->val.obj;
        
        /* retrieve the character mapper from the character set */
        cmap = ((CVmObjCharSet *)vm_objp(vmg_ obj))->get_to_local(vmg0_);
        cmap->add_ref();
    }
    else
    {
        /* it's not a CharacterSet, so it must be a character set name */
        const char *str = charset->get_as_string(vmg0_);
        if (str == 0)
            err_throw(VMERR_BAD_TYPE_BIF);
        
        /* get the length and skip the length prefix */
        size_t len = vmb_get_len(str);
        str += VMB_LEN;

        /* get a null-terminated version of the name */
        char *nm = lib_copy_str(str, len);

        /* 
         *   Create a character mapping for the given name.  Note that this
         *   will automatically add a reference to the mapper on our behalf,
         *   so we don't have to add our own extra reference. 
         */
        cmap = CCharmapToLocal::load(G_host_ifc->get_sys_res_loader(), nm);

        /* done with the null-terminated version of the name string */
        lib_free_str(nm);
    }